

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void luaC_barrier_(lua_State *L,GCObject *o,GCObject *v)

{
  global_State *g;
  
  g = L->l_G;
  if (g->gcstate < 3) {
    reallymarkobject(g,v);
    if ((o->marked & 6) != 0) {
      v->marked = v->marked & 0xf8 | 2;
    }
  }
  else if (g->gckind == '\0') {
    o->marked = g->currentwhite & 0x18 | o->marked & 199;
  }
  return;
}

Assistant:

void luaC_barrier_ (lua_State *L, GCObject *o, GCObject *v) {
  global_State *g = G(L);
  lua_assert(isblack(o) && iswhite(v) && !isdead(g, v) && !isdead(g, o));
  if (keepinvariant(g)) {  /* must keep invariant? */
    reallymarkobject(g, v);  /* restore invariant */
    if (isold(o)) {
      lua_assert(!isold(v));  /* white object could not be old */
      setage(v, G_OLD0);  /* restore generational invariant */
    }
  }
  else {  /* sweep phase */
    lua_assert(issweepphase(g));
    if (g->gckind == KGC_INC)  /* incremental mode? */
      makewhite(g, o);  /* mark 'o' as white to avoid other barriers */
  }
}